

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O3

uint32_t lzma_check_size(lzma_check type)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (type < 0x10) {
    uVar1 = (uint)""[type];
  }
  return uVar1;
}

Assistant:

extern LZMA_API(uint32_t)
lzma_check_size(lzma_check type)
{
	// See file-format.txt section 2.1.1.2.
	static const uint8_t check_sizes[LZMA_CHECK_ID_MAX + 1] = {
		0,
		4, 4, 4,
		8, 8, 8,
		16, 16, 16,
		32, 32, 32,
		64, 64, 64
	};

	if ((unsigned int)(type) > LZMA_CHECK_ID_MAX)
		return UINT32_MAX;

	return check_sizes[(unsigned int)(type)];
}